

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwlock_test.cpp
# Opt level: O3

void __thiscall
SharedTimedMutexTest_TryLockSharedFor_Test<yamc::checked::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>_>
::TestBody(SharedTimedMutexTest_TryLockSharedFor_Test<yamc::checked::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>_>
           *this)

{
  long lVar1;
  long lVar2;
  barrier *pbVar3;
  char *message;
  anon_class_16_2_20c777b2_for_f f;
  TypeParam mtx;
  duration<long,_std::ratio<1L,_1000L>_> local_130;
  duration<long,_std::ratio<1L,_1000L>_> local_128;
  internal local_120 [8];
  undefined8 *local_118;
  undefined8 local_110;
  undefined8 *local_108;
  barrier *local_100;
  barrier *local_f8;
  condition_variable local_f0 [48];
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  TypeParam local_98;
  
  local_110 = 0;
  local_108 = (undefined8 *)operator_new(0x28);
  pbVar3 = (barrier *)(local_108 + 5);
  *local_108 = 0;
  local_108[1] = 0;
  local_108[2] = 0;
  local_108[3] = 0;
  local_108[4] = 0;
  local_100 = pbVar3;
  local_f8 = pbVar3;
  std::condition_variable::condition_variable(local_f0);
  local_a0 = 0;
  local_b0 = 0;
  uStack_a8 = 0;
  local_c0 = 0;
  uStack_b8 = 0;
  yamc::checked::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>::basic_shared_timed_mutex
            ((basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer> *)&local_98);
  lVar1 = std::chrono::_V2::system_clock::now();
  f.step = pbVar3;
  f.mtx = &local_98;
  yamc::test::
  task_runner<SharedTimedMutexTest_TryLockSharedFor_Test<yamc::checked::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>>::TestBody()::_lambda(unsigned_long)_1_>
            ((test *)0x5,(size_t)&local_110,f);
  local_128.__r = (rep)&DAT_00000190;
  lVar2 = std::chrono::_V2::system_clock::now();
  local_130.__r = (lVar2 - lVar1) / 1000;
  testing::internal::
  CmpHelperLE<std::chrono::duration<long,std::ratio<1l,1000l>>,std::chrono::duration<long,std::ratio<1l,1000000l>>>
            (local_120,"std::chrono::milliseconds(200) * 2","sw.elapsed()",&local_128,&local_130);
  if (local_120[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_128);
    if (local_118 == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = (char *)*local_118;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/rwlock_test.cpp"
               ,0x16d,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_130,(Message *)&local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_130);
    if ((long *)local_128.__r != (long *)0x0) {
      (**(code **)(*(long *)local_128.__r + 8))();
    }
  }
  if (local_118 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_118 != local_118 + 2) {
      operator_delete((undefined8 *)*local_118);
    }
    operator_delete(local_118);
  }
  yamc::checked::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>::~basic_shared_timed_mutex
            ((basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer> *)&local_98);
  std::condition_variable::~condition_variable(local_f0);
  if (local_108 != (undefined8 *)0x0) {
    operator_delete(local_108);
  }
  return;
}

Assistant:

TYPED_TEST(SharedTimedMutexTest, TryLockSharedFor)
{
  yamc::test::phaser phaser(1 + TEST_READER_THREADS);
  TypeParam mtx;
  yamc::test::stopwatch<> sw;
  yamc::test::task_runner(
    1 + TEST_READER_THREADS,
    [&](std::size_t id) {
      auto ph = phaser.get(id);
      if (id == 0) {
        // writer-threads
        ASSERT_NO_THROW(mtx.lock());
        ph.advance(1);  // p1
        WAIT_TICKS;
        ASSERT_NO_THROW(mtx.unlock());
      } else {
        // reader-threads
        ph.await();     // p1
        EXPECT_TRUE(mtx.try_lock_shared_for(TEST_NOT_TIMEOUT));
        WAIT_TICKS;
        EXPECT_NO_THROW(mtx.unlock_shared());
      }
    });
  EXPECT_LE(TEST_TICKS * 2, sw.elapsed());
}